

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

EVP_PKEY * d2i_PUBKEY(EVP_PKEY **a,uchar **pp,long length)

{
  bool bVar1;
  EVP_PKEY *__p;
  EVP_PKEY *pEVar2;
  uint8_t *puVar3;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  EVP_PKEY **out_local;
  
  if (length < 0) {
    out_local = (EVP_PKEY **)0x0;
  }
  else {
    CBS_init((CBS *)&ret,*pp,length);
    __p = EVP_parse_public_key((CBS *)&ret);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_40,__p);
    bVar1 = std::operator==(&local_40,(nullptr_t)0x0);
    if (bVar1) {
      out_local = (EVP_PKEY **)0x0;
    }
    else {
      if (a != (EVP_PKEY **)0x0) {
        EVP_PKEY_free(*a);
        pEVar2 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
        *a = pEVar2;
      }
      puVar3 = CBS_data((CBS *)&ret);
      *pp = puVar3;
      out_local = (EVP_PKEY **)
                  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::release(&local_40);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
  return (EVP_PKEY *)out_local;
}

Assistant:

EVP_PKEY *d2i_PUBKEY(EVP_PKEY **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> ret(EVP_parse_public_key(&cbs));
  if (ret == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    EVP_PKEY_free(*out);
    *out = ret.get();
  }
  *inp = CBS_data(&cbs);
  return ret.release();
}